

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O2

int __thiscall Fl_File_Icon::load_fti(Fl_File_Icon *this,char *fti)

{
  uint uVar1;
  int iVar2;
  Fl_Color c;
  FILE *__stream;
  short *psVar3;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  _func_void_char_ptr_varargs *p_Var9;
  double dVar10;
  double dVar11;
  float y;
  float x;
  char command [255];
  char params [255];
  
  __stream = (FILE *)fl_fopen(fti,"rb");
  p_Var9 = Fl::error;
  if (__stream == (FILE *)0x0) {
    piVar4 = __errno_location();
    pcVar6 = strerror(*piVar4);
    (*p_Var9)("Fl_File_Icon::load_fti(): Unable to open \"%s\" - %s",fti,pcVar6);
    iVar2 = -1;
  }
  else {
    uVar8 = 0;
LAB_00202e70:
    uVar7 = 1;
    uVar1 = getc(__stream);
    if (uVar1 != 0xffffffff) {
      iVar2 = isspace(uVar1);
      if (iVar2 == 0) {
        if (uVar1 != 0x23) {
          iVar2 = isalpha(uVar1);
          p_Var9 = Fl::error;
          if (iVar2 == 0) {
            lVar5 = ftell(__stream);
            lVar5 = lVar5 + -1;
            pcVar6 = "Fl_File_Icon::load_fti(): Expected a letter at file position %ld (saw \'%c\')"
            ;
          }
          else {
            command[0] = (char)uVar1;
            while ((uVar1 = getc(__stream), p_Var9 = Fl::error, uVar1 != 0xffffffff &&
                   (uVar1 != 0x28))) {
              if (uVar7 < 0xfe) {
                command[uVar7] = (char)uVar1;
                uVar7 = uVar7 + 1;
              }
            }
            command[uVar7] = '\0';
            if (uVar1 == 0x28) {
              uVar7 = 0;
              while ((uVar1 = getc(__stream), p_Var9 = Fl::error, uVar1 != 0xffffffff &&
                     (uVar1 != 0x29))) {
                if (uVar7 < 0xfe) {
                  params[uVar7] = (char)uVar1;
                  uVar7 = uVar7 + 1;
                }
              }
              params[uVar7] = '\0';
              if (uVar1 == 0x29) {
                uVar1 = getc(__stream);
                p_Var9 = Fl::error;
                if (uVar1 == 0x3b) {
                  iVar2 = bcmp(command,"color",6);
                  if (iVar2 == 0) {
                    iVar2 = bcmp(params,"iconcolor",10);
                    if (iVar2 == 0) {
                      add_color(this,0xffffffff);
                    }
                    else {
                      iVar2 = bcmp(params,"shadowcolor",0xc);
                      if (iVar2 == 0) {
                        add_color(this,0x27);
                      }
                      else {
                        iVar2 = bcmp(params,"outlinecolor",0xd);
                        if (iVar2 == 0) {
                          add_color(this,0x38);
                        }
                        else {
                          c = atoi(params);
                          if ((int)c < 0) {
                            c = fl_color_average(-c >> 4,-c & 0xf,0.5);
                          }
                          add_color(this,c);
                        }
                      }
                    }
                  }
                  else if (CONCAT71(command._1_7_,command[0]) == 0x656e696c6e6762) {
                    add(this,2);
                  }
                  else {
                    iVar2 = bcmp(command,"bgnclosedline",0xe);
                    if (iVar2 != 0) {
                      iVar2 = bcmp(command,"bgnpolygon",0xb);
                      if (iVar2 == 0) {
                        add(this,4);
                        goto LAB_00202e70;
                      }
                      iVar2 = bcmp(command,"bgnoutlinepolygon",0x12);
                      if (iVar2 == 0) {
                        add(this,5);
                        psVar3 = add(this,0);
                        uVar8 = (ulong)((long)psVar3 - (long)this->data_) >> 1;
                      }
                      else {
                        iVar2 = bcmp(command,"endoutlinepolygon",0x12);
                        if ((iVar2 == 0) && ((int)uVar8 != 0)) {
                          iVar2 = bcmp(params,"iconcolor",10);
                          uVar1 = 0xffffffff;
                          if (iVar2 != 0) {
                            iVar2 = bcmp(params,"shadowcolor",0xc);
                            uVar1 = 0x27;
                            if (iVar2 != 0) {
                              iVar2 = bcmp(params,"outlinecolor",0xd);
                              uVar1 = 0x38;
                              if ((iVar2 != 0) && (uVar1 = atoi(params), (int)uVar1 < 0)) {
                                uVar1 = fl_color_average(-uVar1 >> 4,-uVar1 & 0xf,0.5);
                              }
                            }
                          }
                          *(uint *)(this->data_ + (int)uVar8) = uVar1 >> 0x10 | uVar1 << 0x10;
                          uVar8 = 0;
                        }
                        else {
                          iVar2 = bcmp(command,"end",3);
                          if (iVar2 != 0) {
                            iVar2 = bcmp(command,"vertex",7);
                            p_Var9 = Fl::error;
                            if (iVar2 != 0) {
                              lVar5 = ftell(__stream);
                              (*p_Var9)("Fl_File_Icon::load_fti(): Unknown command \"%s\" at file position %ld."
                                        ,command,lVar5 + -1);
                              goto LAB_00203306;
                            }
                            iVar2 = __isoc99_sscanf(params,"%f,%f",&x,&y);
                            if (iVar2 != 2) goto LAB_00203306;
                            dVar10 = rint((double)x * 100.0);
                            dVar11 = rint((double)y * 100.0);
                            add_vertex(this,(int)(short)(int)dVar10,(int)(short)(int)dVar11);
                            goto LAB_00202e70;
                          }
                        }
                      }
                      add(this,0);
                      goto LAB_00202e70;
                    }
                    add(this,3);
                  }
                  goto LAB_00202e70;
                }
                lVar5 = ftell(__stream);
                lVar5 = lVar5 + -1;
                pcVar6 = "Fl_File_Icon::load_fti(): Expected a ; at file position %ld (saw \'%c\')";
              }
              else {
                lVar5 = ftell(__stream);
                lVar5 = lVar5 + -1;
                pcVar6 = "Fl_File_Icon::load_fti(): Expected a ) at file position %ld (saw \'%c\')";
              }
            }
            else {
              lVar5 = ftell(__stream);
              lVar5 = lVar5 + -1;
              pcVar6 = "Fl_File_Icon::load_fti(): Expected a ( at file position %ld (saw \'%c\')";
            }
          }
          (*p_Var9)(pcVar6,lVar5,(ulong)uVar1);
          goto LAB_00203306;
        }
        do {
          iVar2 = getc(__stream);
          if (iVar2 == -1) goto LAB_00203306;
        } while (iVar2 != 10);
      }
      goto LAB_00202e70;
    }
LAB_00203306:
    fclose(__stream);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int					// O - 0 on success, non-zero on error
Fl_File_Icon::load_fti(const char *fti)	// I - File to read from
{
  FILE	*fp;			// File pointer
  int	ch;			// Current character
  char	command[255],		// Command string ("vertex", etc.)
	params[255],		// Parameter string ("10.0,20.0", etc.)
	*ptr;			// Pointer into strings
  int	outline;		// Outline polygon


  // Try to open the file...
  if ((fp = fl_fopen(fti, "rb")) == NULL)
  {
    Fl::error("Fl_File_Icon::load_fti(): Unable to open \"%s\" - %s",
              fti, strerror(errno));
    return -1;
  }

  // Read the entire file, adding data as needed...
  outline = 0;

  while ((ch = getc(fp)) != EOF)
  {
    // Skip whitespace
    if (isspace(ch))
      continue;

    // Skip comments starting with "#"...
    if (ch == '#')
    {
      while ((ch = getc(fp)) != EOF)
        if (ch == '\n')
	  break;

      if (ch == EOF)
        break;
      else
        continue;
    }

    // OK, this character better be a letter...
    if (!isalpha(ch))
    {
      Fl::error("Fl_File_Icon::load_fti(): Expected a letter at file position %ld (saw '%c')",
                ftell(fp) - 1, ch);
      break;
    }

    // Scan the command name...
    ptr    = command;
    *ptr++ = ch;

    while ((ch = getc(fp)) != EOF)
    {
      if (ch == '(')
        break;
      else if (ptr < (command + sizeof(command) - 1))
        *ptr++ = ch;
    }

    *ptr++ = '\0';

    // Make sure we stopped on a parenthesis...
    if (ch != '(')
    {
      Fl::error("Fl_File_Icon::load_fti(): Expected a ( at file position %ld (saw '%c')",
                ftell(fp) - 1, ch);
      break;
    }

    // Scan the parameters...
    ptr = params;

    while ((ch = getc(fp)) != EOF)
    {
      if (ch == ')')
        break;
      else if (ptr < (params + sizeof(params) - 1))
        *ptr++ = ch;
    }

    *ptr++ = '\0';

    // Make sure we stopped on a parenthesis...
    if (ch != ')')
    {
      Fl::error("Fl_File_Icon::load_fti(): Expected a ) at file position %ld (saw '%c')",
                ftell(fp) - 1, ch);
      break;
    }

    // Make sure the next character is a semicolon...
    if ((ch = getc(fp)) != ';')
    {
      Fl::error("Fl_File_Icon::load_fti(): Expected a ; at file position %ld (saw '%c')",
                ftell(fp) - 1, ch);
      break;
    }

    // Now process the command...
    if (strcmp(command, "color") == 0)
    {
      // Set the color; for negative colors blend the two primaries to
      // produce a composite color.  Also, the following symbolic color
      // names are understood:
      //
      //     name           FLTK color
      //     -------------  ----------
      //     iconcolor      FL_ICON_COLOR; mapped to the icon color in
      //                    Fl_File_Icon::draw()
      //     shadowcolor    FL_DARK3
      //     outlinecolor   FL_BLACK
      if (strcmp(params, "iconcolor") == 0)
        add_color(FL_ICON_COLOR);
      else if (strcmp(params, "shadowcolor") == 0)
        add_color(FL_DARK3);
      else if (strcmp(params, "outlinecolor") == 0)
        add_color(FL_BLACK);
      else
      {
        int c = atoi(params);	// Color value


        if (c < 0)
	{
	  // Composite color; compute average...
	  c = -c;
	  add_color(fl_color_average((Fl_Color)(c >> 4),
	                             (Fl_Color)(c & 15), 0.5f));
	}
	else
	  add_color((Fl_Color)c);
      }
    }
    else if (strcmp(command, "bgnline") == 0)
      add(LINE);
    else if (strcmp(command, "bgnclosedline") == 0)
      add(CLOSEDLINE);
    else if (strcmp(command, "bgnpolygon") == 0)
      add(POLYGON);
    else if (strcmp(command, "bgnoutlinepolygon") == 0)
    {
      add(OUTLINEPOLYGON);
      outline = add(0) - data_;
      add(0);
    }
    else if (strcmp(command, "endoutlinepolygon") == 0 && outline)
    {
      unsigned cval; // Color value

      // Set the outline color; see above for valid values...
      if (strcmp(params, "iconcolor") == 0)
        cval = FL_ICON_COLOR;
      else if (strcmp(params, "shadowcolor") == 0)
        cval = FL_DARK3;
      else if (strcmp(params, "outlinecolor") == 0)
        cval = FL_BLACK;
      else
      {
        int c = atoi(params);	// Color value


        if (c < 0)
	{
	  // Composite color; compute average...
	  c = -c;
	  cval = fl_color_average((Fl_Color)(c >> 4), (Fl_Color)(c & 15), 0.5f);
	}
	else
	  cval = c;
      }

      // Store outline color...
      data_[outline]     = cval >> 16;
      data_[outline + 1] = cval;

      outline = 0;
      add(END);
    }
    else if (strncmp(command, "end", 3) == 0)
      add(END);
    else if (strcmp(command, "vertex") == 0)
    {
      float x, y;		// Coordinates of vertex


      if (sscanf(params, "%f,%f", &x, &y) != 2)
        break;

      add_vertex((short)(int)rint(x * 100.0), (short)(int)rint(y * 100.0));
    }
    else
    {
      Fl::error("Fl_File_Icon::load_fti(): Unknown command \"%s\" at file position %ld.",
                command, ftell(fp) - 1);
      break;
    }
  }

  // Close the file and return...
  fclose(fp);

#ifdef DEBUG
  printf("Icon File \"%s\":\n", fti);
  for (int i = 0; i < num_data_; i ++)
    printf("    %d,\n", data_[i]);
#endif /* DEBUG */

  return 0;
}